

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O1

ExprNode * __thiscall Parser::factor(Parser *this)

{
  char cVar1;
  int iVar2;
  InfixExprNode *this_00;
  ExprNode *pEVar3;
  ExprNode **ppEVar4;
  long *plVar5;
  long *plVar6;
  Token op;
  Token t;
  Token local_360;
  Token local_2f0;
  long *local_280 [2];
  long local_270 [2];
  undefined1 local_260 [32];
  _Alloc_hider local_240;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_230;
  bool local_220;
  bool bStack_21f;
  bool bStack_21e;
  bool bStack_21d;
  bool bStack_21c;
  bool bStack_21b;
  char cStack_21a;
  undefined1 uStack_219;
  undefined4 uStack_218;
  undefined4 uStack_214;
  _Alloc_hider local_210;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_200;
  undefined1 local_1f0 [32];
  _Alloc_hider local_1d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1c0;
  bool local_1b0;
  bool bStack_1af;
  bool bStack_1ae;
  bool bStack_1ad;
  bool bStack_1ac;
  bool bStack_1ab;
  char cStack_1aa;
  undefined1 uStack_1a9;
  undefined4 uStack_1a8;
  undefined4 uStack_1a4;
  _Alloc_hider local_1a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_190;
  undefined1 local_180 [32];
  _Alloc_hider local_160;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_150;
  bool local_140;
  bool bStack_13f;
  bool bStack_13e;
  bool bStack_13d;
  bool bStack_13c;
  bool bStack_13b;
  char cStack_13a;
  undefined1 uStack_139;
  undefined4 uStack_138;
  undefined4 uStack_134;
  _Alloc_hider local_130;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_120;
  undefined1 local_110 [32];
  _Alloc_hider local_f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e0;
  bool local_d0;
  bool bStack_cf;
  bool bStack_ce;
  bool bStack_cd;
  bool bStack_cc;
  bool bStack_cb;
  char cStack_ca;
  undefined1 uStack_c9;
  undefined4 uStack_c8;
  undefined4 uStack_c4;
  _Alloc_hider local_c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b0;
  undefined1 local_a0 [32];
  _Alloc_hider local_80;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_70;
  bool local_60;
  bool bStack_5f;
  bool bStack_5e;
  bool bStack_5d;
  bool bStack_5c;
  bool bStack_5b;
  char cStack_5a;
  undefined1 uStack_59;
  undefined4 uStack_58;
  undefined4 uStack_54;
  _Alloc_hider local_50;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  
  Tokenizer::getToken(&local_360,this->tokenizer);
  if (local_360._symbol == '-') {
    this_00 = (InfixExprNode *)operator_new(0x90);
    local_1f0._0_8_ = local_1f0 + 0x10;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_1f0,local_360._name._M_dataplus._M_p,
               local_360._name._M_dataplus._M_p + local_360._name._M_string_length);
    local_1d0._M_p = (pointer)&local_1c0;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_1d0,local_360._relOp._M_dataplus._M_p,
               local_360._relOp._M_dataplus._M_p + local_360._relOp._M_string_length);
    local_1b0 = local_360._eof;
    bStack_1af = local_360._eol;
    bStack_1ae = local_360._ind;
    bStack_1ad = local_360._ded;
    bStack_1ac = local_360._isWholeNumber;
    bStack_1ab = local_360._isString;
    cStack_1aa = local_360._symbol;
    uStack_1a9 = local_360._71_1_;
    uStack_1a8 = local_360._wholeNumber._0_4_;
    uStack_1a4 = local_360._wholeNumber._4_4_;
    local_1a0._M_p = (pointer)&local_190;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_1a0,local_360._string._M_dataplus._M_p,
               local_360._string._M_dataplus._M_p + local_360._string._M_string_length);
    InfixExprNode::InfixExprNode(this_00,(Token *)local_1f0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a0._M_p != &local_190) {
      operator_delete(local_1a0._M_p,local_190._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d0._M_p != &local_1c0) {
      operator_delete(local_1d0._M_p,local_1c0._M_allocated_capacity + 1);
    }
    if ((undefined1 *)local_1f0._0_8_ != local_1f0 + 0x10) {
      operator_delete((void *)local_1f0._0_8_,local_1f0._16_8_ + 1);
    }
    Token::Token(&local_2f0);
    local_2f0._wholeNumber = 0.0;
    local_2f0._isWholeNumber = true;
    pEVar3 = (ExprNode *)operator_new(0x80);
    local_260._0_8_ = local_260 + 0x10;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_260,local_2f0._name._M_dataplus._M_p,
               local_2f0._name._M_dataplus._M_p + local_2f0._name._M_string_length);
    local_240._M_p = (pointer)&local_230;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_240,local_2f0._relOp._M_dataplus._M_p,
               local_2f0._relOp._M_dataplus._M_p + local_2f0._relOp._M_string_length);
    local_220 = local_2f0._eof;
    bStack_21f = local_2f0._eol;
    bStack_21e = local_2f0._ind;
    bStack_21d = local_2f0._ded;
    bStack_21c = local_2f0._isWholeNumber;
    bStack_21b = local_2f0._isString;
    cStack_21a = local_2f0._symbol;
    uStack_219 = local_2f0._71_1_;
    uStack_218 = local_2f0._wholeNumber._0_4_;
    uStack_214 = local_2f0._wholeNumber._4_4_;
    local_210._M_p = (pointer)&local_200;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_210,local_2f0._string._M_dataplus._M_p,
               local_2f0._string._M_dataplus._M_p + local_2f0._string._M_string_length);
    WholeNumber::WholeNumber((WholeNumber *)pEVar3,(Token *)local_260);
    ppEVar4 = InfixExprNode::left(this_00);
    *ppEVar4 = pEVar3;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_210._M_p != &local_200) {
      operator_delete(local_210._M_p,local_200._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_240._M_p != &local_230) {
      operator_delete(local_240._M_p,local_230._M_allocated_capacity + 1);
    }
    if ((undefined1 *)local_260._0_8_ != local_260 + 0x10) {
      operator_delete((void *)local_260._0_8_,local_260._16_8_ + 1);
    }
    pEVar3 = factor(this);
    ppEVar4 = InfixExprNode::right(this_00);
    *ppEVar4 = pEVar3;
  }
  else {
    Tokenizer::getToken(&local_2f0,this->tokenizer);
    Tokenizer::ungetToken(this->tokenizer);
    if (local_2f0._symbol == '[') {
      this_00 = (InfixExprNode *)operator_new(0x88);
      plVar6 = (long *)(local_a0 + 0x10);
      local_a0._0_8_ = plVar6;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_a0,local_360._name._M_dataplus._M_p,
                 local_360._name._M_dataplus._M_p + local_360._name._M_string_length);
      local_80._M_p = (pointer)&local_70;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_80,local_360._relOp._M_dataplus._M_p,
                 local_360._relOp._M_dataplus._M_p + local_360._relOp._M_string_length);
      local_60 = local_360._eof;
      bStack_5f = local_360._eol;
      bStack_5e = local_360._ind;
      bStack_5d = local_360._ded;
      bStack_5c = local_360._isWholeNumber;
      bStack_5b = local_360._isString;
      cStack_5a = local_360._symbol;
      uStack_59 = local_360._71_1_;
      uStack_58 = local_360._wholeNumber._0_4_;
      uStack_54 = local_360._wholeNumber._4_4_;
      local_50._M_p = (pointer)&local_40;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_50,local_360._string._M_dataplus._M_p,
                 local_360._string._M_dataplus._M_p + local_360._string._M_string_length);
      pEVar3 = sub(this);
      SubExpr::SubExpr((SubExpr *)this_00,(Token *)local_a0,pEVar3);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_p != &local_40) {
        operator_delete(local_50._M_p,local_40._M_allocated_capacity + 1);
      }
      plVar5 = (long *)local_a0._0_8_;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_80._M_p != &local_70) {
        operator_delete(local_80._M_p,local_70._M_allocated_capacity + 1);
        plVar5 = (long *)local_a0._0_8_;
      }
    }
    else {
      local_280[0] = local_270;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_280,local_360._name._M_dataplus._M_p,
                 local_360._name._M_dataplus._M_p + local_360._name._M_string_length);
      iVar2 = std::__cxx11::string::compare((char *)local_280);
      if (iVar2 == 0) {
        cVar1 = local_2f0._symbol;
        if (local_280[0] != local_270) {
          operator_delete(local_280[0],local_270[0] + 1);
        }
        if (cVar1 == '(') {
          this_00 = (InfixExprNode *)len(this);
          goto LAB_0010c33f;
        }
      }
      else if (local_280[0] != local_270) {
        operator_delete(local_280[0],local_270[0] + 1);
      }
      if ((local_2f0._symbol == '(') && (local_360._name._M_string_length != 0)) {
        plVar6 = (long *)(local_110 + 0x10);
        local_110._0_8_ = plVar6;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_110,local_360._name._M_dataplus._M_p,
                   local_360._name._M_dataplus._M_p + local_360._name._M_string_length);
        local_f0._M_p = (pointer)&local_e0;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_f0,local_360._relOp._M_dataplus._M_p,
                   local_360._relOp._M_dataplus._M_p + local_360._relOp._M_string_length);
        local_d0 = local_360._eof;
        bStack_cf = local_360._eol;
        bStack_ce = local_360._ind;
        bStack_cd = local_360._ded;
        bStack_cc = local_360._isWholeNumber;
        bStack_cb = local_360._isString;
        cStack_ca = local_360._symbol;
        uStack_c9 = local_360._71_1_;
        uStack_c8 = local_360._wholeNumber._0_4_;
        uStack_c4 = local_360._wholeNumber._4_4_;
        local_c0._M_p = (pointer)&local_b0;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_c0,local_360._string._M_dataplus._M_p,
                   local_360._string._M_dataplus._M_p + local_360._string._M_string_length);
        this_00 = (InfixExprNode *)call(this,(Token *)local_110);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c0._M_p != &local_b0) {
          operator_delete(local_c0._M_p,local_b0._M_allocated_capacity + 1);
        }
        plVar5 = (long *)local_110._0_8_;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f0._M_p != &local_e0) {
          operator_delete(local_f0._M_p,local_e0._M_allocated_capacity + 1);
          plVar5 = (long *)local_110._0_8_;
        }
      }
      else {
        plVar6 = (long *)(local_180 + 0x10);
        local_180._0_8_ = plVar6;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_180,local_360._name._M_dataplus._M_p,
                   local_360._name._M_dataplus._M_p + local_360._name._M_string_length);
        local_160._M_p = (pointer)&local_150;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_160,local_360._relOp._M_dataplus._M_p,
                   local_360._relOp._M_dataplus._M_p + local_360._relOp._M_string_length);
        local_140 = local_360._eof;
        bStack_13f = local_360._eol;
        bStack_13e = local_360._ind;
        bStack_13d = local_360._ded;
        bStack_13c = local_360._isWholeNumber;
        bStack_13b = local_360._isString;
        cStack_13a = local_360._symbol;
        uStack_139 = local_360._71_1_;
        uStack_138 = local_360._wholeNumber._0_4_;
        uStack_134 = local_360._wholeNumber._4_4_;
        local_130._M_p = (pointer)&local_120;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_130,local_360._string._M_dataplus._M_p,
                   local_360._string._M_dataplus._M_p + local_360._string._M_string_length);
        this_00 = (InfixExprNode *)atom(this,(Token *)local_180);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_130._M_p != &local_120) {
          operator_delete(local_130._M_p,local_120._M_allocated_capacity + 1);
        }
        plVar5 = (long *)local_180._0_8_;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_160._M_p != &local_150) {
          operator_delete(local_160._M_p,local_150._M_allocated_capacity + 1);
          plVar5 = (long *)local_180._0_8_;
        }
      }
    }
    if (plVar5 != plVar6) {
      operator_delete(plVar5,*plVar6 + 1);
    }
  }
LAB_0010c33f:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f0._string._M_dataplus._M_p != &local_2f0._string.field_2) {
    operator_delete(local_2f0._string._M_dataplus._M_p,
                    local_2f0._string.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f0._relOp._M_dataplus._M_p != &local_2f0._relOp.field_2) {
    operator_delete(local_2f0._relOp._M_dataplus._M_p,
                    local_2f0._relOp.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f0._name._M_dataplus._M_p != &local_2f0._name.field_2) {
    operator_delete(local_2f0._name._M_dataplus._M_p,
                    local_2f0._name.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_360._string._M_dataplus._M_p != &local_360._string.field_2) {
    operator_delete(local_360._string._M_dataplus._M_p,
                    local_360._string.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_360._relOp._M_dataplus._M_p != &local_360._relOp.field_2) {
    operator_delete(local_360._relOp._M_dataplus._M_p,
                    local_360._relOp.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_360._name._M_dataplus._M_p != &local_360._name.field_2) {
    operator_delete(local_360._name._M_dataplus._M_p,
                    local_360._name.field_2._M_allocated_capacity + 1);
  }
  return &this_00->super_ExprNode;
}

Assistant:

ExprNode *Parser::factor() {
    // factor: { - } factor | atom

    Token op = tokenizer.getToken();
    if(op.isSubtractionOperator()){
        auto* negativeNumber = new InfixExprNode(op);
        Token t;
        t.setWholeNumber(0);
        negativeNumber->left() = new WholeNumber(t);
        ExprNode* f = factor();
        negativeNumber->right() = f;
        return negativeNumber;
    } else{ //if(op.isName()) {
        //tokenizer.ungetToken();
        Token check = tokenizer.getToken();
        tokenizer.ungetToken();
        if(check.isOpenBrace()) {//subscription
            return new SubExpr(op,sub()); //ID[test]
        }else if(op.getName() == "len"
        && check.isOpenParen()){
            return len();
        }else if(check.isOpenParen() && op.isName()){// cal
            return call(op);
        }else {
            ExprNode *a = atom(op);
            return a;
        }

    }
}